

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O2

void FSE_encodeSymbol(BIT_CStream_t *bitC,FSE_CState_t *statePtr,uint symbol)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  iVar1 = *(int *)((long)statePtr->symbolTT + (ulong)symbol * 8);
  pvVar2 = statePtr->stateTable;
  lVar3 = (ulong)*(uint *)((long)statePtr->symbolTT + (ulong)symbol * 8 + 4) + statePtr->value;
  BIT_addBits(bitC,statePtr->value,(uint)((ulong)lVar3 >> 0x10));
  statePtr->value =
       (ulong)*(ushort *)
               ((long)pvVar2 +
               (long)iVar1 * 2 + (statePtr->value >> ((byte)((ulong)lVar3 >> 0x10) & 0x3f)) * 2);
  return;
}

Assistant:

MEM_STATIC void FSE_encodeSymbol(BIT_CStream_t* bitC, FSE_CState_t* statePtr, unsigned symbol)
{
    FSE_symbolCompressionTransform const symbolTT = ((const FSE_symbolCompressionTransform*)(statePtr->symbolTT))[symbol];
    const U16* const stateTable = (const U16*)(statePtr->stateTable);
    U32 const nbBitsOut  = (U32)((statePtr->value + symbolTT.deltaNbBits) >> 16);
    BIT_addBits(bitC, statePtr->value, nbBitsOut);
    statePtr->value = stateTable[ (statePtr->value >> nbBitsOut) + symbolTT.deltaFindState];
}